

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

CaseRequirement *
glu::sl::CaseRequirement::createAnyExtensionRequirement
          (CaseRequirement *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alternatives,deUint32 effectiveStages)

{
  RequiredExtension local_40;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->extension).alternatives.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->extension).alternatives.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->extension).alternatives.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extension).alternatives.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->requiredCap).enumName = 0;
  (__return_storage_ptr__->requiredCap).referenceValue = 0;
  __return_storage_ptr__->type = TYPE_EXTENSION;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40.alternatives,alternatives);
  local_40.effectiveStages = effectiveStages;
  RequiredExtension::operator=(&__return_storage_ptr__->extension,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.alternatives);
  return __return_storage_ptr__;
}

Assistant:

static CaseRequirement createAnyExtensionRequirement (const vector<string>& alternatives, deUint32 effectiveStages)
	{
		CaseRequirement req;
		req.type		= TYPE_EXTENSION;
		req.extension	= RequiredExtension(alternatives, effectiveStages);
		return req;
	}